

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O0

void __thiscall
cmLocalGenerator::GenerateFrameworkInfoPList
          (cmLocalGenerator *this,cmGeneratorTarget *target,string *targetName,string *fname)

{
  ScopePushPop SVar1;
  bool bVar2;
  char *pcVar3;
  ulong uVar4;
  ostream *poVar5;
  string *psVar6;
  char *local_350;
  cmNewLineStyle local_328;
  allocator<char> local_321;
  string local_320;
  allocator<char> local_2f9;
  string local_2f8;
  allocator<char> local_2d1;
  string local_2d0;
  allocator<char> local_2a9;
  string local_2a8;
  allocator<char> local_281;
  string local_280;
  ScopePushPop local_260;
  ScopePushPop varScope;
  cmMakefile *mf;
  string local_248;
  undefined1 local_228 [8];
  ostringstream e;
  undefined1 local_b0 [8];
  string inMod;
  undefined1 local_88 [8];
  string inFile;
  allocator<char> local_51;
  string local_50;
  char *local_30;
  char *in;
  string *fname_local;
  string *targetName_local;
  cmGeneratorTarget *target_local;
  cmLocalGenerator *this_local;
  
  in = (char *)fname;
  fname_local = targetName;
  targetName_local = (string *)target;
  target_local = (cmGeneratorTarget *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"MACOSX_FRAMEWORK_INFO_PLIST",&local_51);
  pcVar3 = cmGeneratorTarget::GetProperty(target,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  if ((pcVar3 == (char *)0x0) || (local_350 = pcVar3, *pcVar3 == '\0')) {
    local_350 = "MacOSXFrameworkInfo.plist.in";
  }
  local_30 = pcVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_88,local_350,(allocator<char> *)(inMod.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(inMod.field_2._M_local_buf + 0xf));
  bVar2 = cmsys::SystemTools::FileIsFullPath((string *)local_88);
  if (!bVar2) {
    cmMakefile::GetModulesFile((string *)local_b0,this->Makefile,(string *)local_88);
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) == 0) {
      std::__cxx11::string::operator=((string *)local_88,(string *)local_b0);
    }
    std::__cxx11::string::~string((string *)local_b0);
  }
  bVar2 = cmsys::SystemTools::FileExists((string *)local_88,true);
  if (bVar2) {
    varScope.Makefile = this->Makefile;
    cmMakefile::ScopePushPop::ScopePushPop(&local_260,varScope.Makefile);
    SVar1.Makefile = varScope.Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_280,"MACOSX_FRAMEWORK_NAME",&local_281);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    cmMakefile::AddDefinition(SVar1.Makefile,&local_280,pcVar3);
    std::__cxx11::string::~string((string *)&local_280);
    std::allocator<char>::~allocator(&local_281);
    psVar6 = targetName_local;
    SVar1 = varScope;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2a8,"MACOSX_FRAMEWORK_ICON_FILE",&local_2a9);
    cmLGInfoProp(SVar1.Makefile,(cmGeneratorTarget *)psVar6,&local_2a8);
    std::__cxx11::string::~string((string *)&local_2a8);
    std::allocator<char>::~allocator(&local_2a9);
    psVar6 = targetName_local;
    SVar1 = varScope;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2d0,"MACOSX_FRAMEWORK_IDENTIFIER",&local_2d1);
    cmLGInfoProp(SVar1.Makefile,(cmGeneratorTarget *)psVar6,&local_2d0);
    std::__cxx11::string::~string((string *)&local_2d0);
    std::allocator<char>::~allocator(&local_2d1);
    psVar6 = targetName_local;
    SVar1 = varScope;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2f8,"MACOSX_FRAMEWORK_SHORT_VERSION_STRING",&local_2f9);
    cmLGInfoProp(SVar1.Makefile,(cmGeneratorTarget *)psVar6,&local_2f8);
    std::__cxx11::string::~string((string *)&local_2f8);
    std::allocator<char>::~allocator(&local_2f9);
    psVar6 = targetName_local;
    SVar1 = varScope;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_320,"MACOSX_FRAMEWORK_BUNDLE_VERSION",&local_321);
    cmLGInfoProp(SVar1.Makefile,(cmGeneratorTarget *)psVar6,&local_320);
    std::__cxx11::string::~string((string *)&local_320);
    std::allocator<char>::~allocator(&local_321);
    pcVar3 = in;
    SVar1 = varScope;
    cmNewLineStyle::cmNewLineStyle(&local_328);
    cmMakefile::ConfigureFile
              (SVar1.Makefile,(string *)local_88,(string *)pcVar3,false,false,false,local_328);
    cmMakefile::ScopePushPop::~ScopePushPop(&local_260);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_228);
    poVar5 = std::operator<<((ostream *)local_228,"Target ");
    psVar6 = cmGeneratorTarget::GetName_abi_cxx11_((cmGeneratorTarget *)targetName_local);
    poVar5 = std::operator<<(poVar5,(string *)psVar6);
    poVar5 = std::operator<<(poVar5," Info.plist template \"");
    poVar5 = std::operator<<(poVar5,(string *)local_88);
    std::operator<<(poVar5,"\" could not be found.");
    std::__cxx11::ostringstream::str();
    cmSystemTools::Error(&local_248);
    std::__cxx11::string::~string((string *)&local_248);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_228);
  }
  std::__cxx11::string::~string((string *)local_88);
  return;
}

Assistant:

void cmLocalGenerator::GenerateFrameworkInfoPList(
  cmGeneratorTarget* target, const std::string& targetName,
  const std::string& fname)
{
  // Find the Info.plist template.
  const char* in = target->GetProperty("MACOSX_FRAMEWORK_INFO_PLIST");
  std::string inFile = (in && *in) ? in : "MacOSXFrameworkInfo.plist.in";
  if (!cmSystemTools::FileIsFullPath(inFile)) {
    std::string inMod = this->Makefile->GetModulesFile(inFile);
    if (!inMod.empty()) {
      inFile = inMod;
    }
  }
  if (!cmSystemTools::FileExists(inFile, true)) {
    std::ostringstream e;
    e << "Target " << target->GetName() << " Info.plist template \"" << inFile
      << "\" could not be found.";
    cmSystemTools::Error(e.str());
    return;
  }

  // Convert target properties to variables in an isolated makefile
  // scope to configure the file.  If properties are set they will
  // override user make variables.  If not the configuration will fall
  // back to the directory-level values set by the user.
  cmMakefile* mf = this->Makefile;
  cmMakefile::ScopePushPop varScope(mf);
  mf->AddDefinition("MACOSX_FRAMEWORK_NAME", targetName.c_str());
  cmLGInfoProp(mf, target, "MACOSX_FRAMEWORK_ICON_FILE");
  cmLGInfoProp(mf, target, "MACOSX_FRAMEWORK_IDENTIFIER");
  cmLGInfoProp(mf, target, "MACOSX_FRAMEWORK_SHORT_VERSION_STRING");
  cmLGInfoProp(mf, target, "MACOSX_FRAMEWORK_BUNDLE_VERSION");
  mf->ConfigureFile(inFile, fname, false, false, false);
}